

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O2

void test_other_thread(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char local_b8 [8];
  char b [128];
  int result;
  
  ProfilerRegisterThread();
  iVar1 = *g_ticks_count;
  std::mutex::lock(&mutex);
  while (*g_ticks_count < iVar1 + 0x1e) {
    iVar3 = 0;
    iVar2 = g_iters * 10;
    if (g_iters * 10 < 1) {
      iVar2 = iVar3;
    }
    for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
    }
    snprintf(local_b8,0x80,"other: %d");
    b._120_8_ = local_b8;
    (*noopt_helper)(b + 0x78);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  return;
}

Assistant:

static void test_other_thread() {
#ifndef NO_THREADS
  ProfilerRegisterThread();

  int result = 0;
  char b[128];
  // Get at least 30 ticks
  int limit = *g_ticks_count + 30;

  std::lock_guard ml(mutex);

  while (*g_ticks_count < limit) {
    for (int i = 0; i < g_iters * 10; ++i ) {
      *const_cast<volatile int*>(&result) ^= i;
    }
    snprintf(b, sizeof(b), "other: %d", result);  // get some libc action
    (void)noopt(b); // 'consume' b. Ensure that smart compiler doesn't
                    // remove snprintf call
  }
#endif
}